

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.h
# Opt level: O2

aiMetadata * aiMetadata::Alloc(uint numProperties)

{
  ulong uVar1;
  aiMetadata *paVar2;
  aiString *paVar3;
  aiMetadataEntry *__s;
  aiString *paVar4;
  
  if (numProperties == 0) {
    paVar2 = (aiMetadata *)0x0;
  }
  else {
    uVar1 = (ulong)numProperties;
    paVar2 = (aiMetadata *)operator_new(0x18);
    paVar2->mNumProperties = numProperties;
    paVar3 = (aiString *)operator_new__(uVar1 * 0x404);
    paVar4 = paVar3;
    do {
      paVar4->length = 0;
      paVar4->data[0] = '\0';
      memset(paVar4->data + 1,0x1b,0x3ff);
      paVar4 = paVar4 + 1;
    } while (paVar4 != paVar3 + uVar1);
    paVar2->mKeys = paVar3;
    __s = (aiMetadataEntry *)operator_new__(uVar1 << 4);
    memset(__s,0,uVar1 << 4);
    paVar2->mValues = __s;
  }
  return paVar2;
}

Assistant:

static inline
    aiMetadata *Alloc( unsigned int numProperties ) {
        if ( 0 == numProperties ) {
            return nullptr;
        }

        aiMetadata *data = new aiMetadata;
        data->mNumProperties = numProperties;
        data->mKeys = new aiString[ data->mNumProperties ]();
        data->mValues = new aiMetadataEntry[ data->mNumProperties ]();

        return data;
    }